

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IexBaseExc.cpp
# Opt level: O0

BaseExc * __thiscall Iex_2_5::BaseExc::operator=(BaseExc *this,BaseExc *be)

{
  BaseExc *in_RSI;
  BaseExc *in_RDI;
  
  if (in_RDI != in_RSI) {
    std::__cxx11::string::operator=((string *)&in_RDI->_message,(string *)&in_RSI->_message);
    std::__cxx11::string::operator=((string *)&in_RDI->_stackTrace,(string *)&in_RSI->_stackTrace);
  }
  return in_RDI;
}

Assistant:

BaseExc &
BaseExc::operator = (const BaseExc& be) throw ()
{
    if (this != &be)
    {
        _message = be._message;
        _stackTrace = be._stackTrace;
    }

    return *this;
}